

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

TIFFReadDirEntryErr TIFFReadDirEntrySlong(TIFF *tif,TIFFDirEntry *direntry,int32_t *value)

{
  TIFFReadDirEntryErr TVar1;
  ulong in_RAX;
  bool bVar2;
  uint16_t m;
  undefined8 local_18;
  
  if (direntry->tdir_count != 1) {
    return TIFFReadDirEntryErrCount;
  }
  TVar1 = TIFFReadDirEntryErrType;
  local_18._2_6_ = (undefined6)(in_RAX >> 0x10);
  local_18 = in_RAX;
  switch(direntry->tdir_type) {
  case 1:
    local_18._0_4_ = (uint)*(byte *)&direntry->tdir_offset;
    break;
  default:
    goto switchD_00299b68_caseD_2;
  case 3:
    local_18 = CONCAT62(local_18._2_6_,(direntry->tdir_offset).toff_short);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabShort((uint16_t *)&local_18);
    }
    local_18._0_4_ = (uint)(ushort)local_18;
    break;
  case 4:
    local_18 = CONCAT44((int)(in_RAX >> 0x20),(direntry->tdir_offset).toff_long);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabLong((uint32_t *)&local_18);
    }
    TVar1 = (uint)local_18 >> 0x1d & TIFFReadDirEntryErrRange;
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    break;
  case 6:
    local_18._0_4_ = (uint)*(char *)&direntry->tdir_offset;
    break;
  case 8:
    local_18 = CONCAT62(local_18._2_6_,(direntry->tdir_offset).toff_short);
    if ((tif->tif_flags & 0x80) != 0) {
      TIFFSwabShort((uint16_t *)&local_18);
    }
    local_18._0_4_ = (uint)(short)(ushort)local_18;
    break;
  case 9:
    *value = (direntry->tdir_offset).toff_long;
    if ((tif->tif_flags & 0x80) == 0) {
      return TIFFReadDirEntryErrOk;
    }
    TIFFSwabLong((uint32_t *)value);
    return TIFFReadDirEntryErrOk;
  case 0x10:
    TVar1 = TIFFReadDirEntryCheckedLong8(tif,direntry,&local_18);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    bVar2 = 0x7fffffff < local_18;
    if (0x7fffffff < local_18) {
LAB_00299bf6:
      return (uint)bVar2 << 2;
    }
    goto LAB_00299bd3;
  case 0x11:
    TVar1 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_18);
    if (TVar1 != TIFFReadDirEntryErrOk) {
      return TVar1;
    }
    bVar2 = (long)(int)local_18 != local_18;
    if (bVar2) goto LAB_00299bf6;
LAB_00299bd3:
    *value = (int32_t)local_18;
    goto LAB_00299c43;
  }
  *value = (uint)local_18;
LAB_00299c43:
  TVar1 = TIFFReadDirEntryErrOk;
switchD_00299b68_caseD_2:
  return TVar1;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySlong(TIFF *tif, TIFFDirEntry *direntry, int32_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
        {
            uint16_t m;
            TIFFReadDirEntryCheckedShort(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
        {
            int16_t m;
            TIFFReadDirEntryCheckedSshort(tif, direntry, &m);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSlongLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
            TIFFReadDirEntryCheckedSlong(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSlongLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSlongSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int32_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}